

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int insertNewKeyValue(MAP_HANDLE_DATA *handleData,char *key,char *value)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  char **ppcVar4;
  LOGGER_LOG p_Var5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  
  uVar9 = handleData->count + 1;
  sVar2 = 0xffffffffffffffff;
  if (uVar9 == 0) {
    uVar9 = sVar2;
  }
  if ((uVar9 >> 0x3d == 0) &&
     (ppcVar4 = (char **)realloc(handleData->keys,uVar9 << 3), ppcVar4 != (char **)0x0)) {
    handleData->keys = ppcVar4;
    sVar1 = handleData->count;
    ppcVar4[sVar1] = (char *)0x0;
    uVar9 = sVar1 + 1;
    if (uVar9 == 0) {
      uVar9 = sVar2;
    }
    if ((0x1fffffffffffffff < uVar9) ||
       (ppcVar4 = (char **)realloc(handleData->values,uVar9 * 8), sVar2 = uVar9 * 8,
       ppcVar4 == (char **)0x0)) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                  ,"Map_IncreaseStorageKeysValues",0xb9,1,"realloc error, size:%zu",sVar2);
      }
      uVar9 = handleData->count;
      if (uVar9 == 0) {
        free(handleData->keys);
        handleData->keys = (char **)0x0;
      }
      else {
        if ((0x1fffffffffffffff < uVar9) ||
           (ppcVar4 = (char **)realloc(handleData->keys,uVar9 * 8), ppcVar4 == (char **)0x0)) {
          p_Var5 = xlogging_get_log_function();
          iVar3 = 0x138;
          if (p_Var5 == (LOGGER_LOG)0x0) {
            return 0x138;
          }
          pcVar7 = "Map_IncreaseStorageKeysValues";
          pcVar8 = "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu";
          iVar6 = 0xc6;
          goto LAB_0010ef98;
        }
        handleData->keys = ppcVar4;
      }
      return 0x138;
    }
    handleData->values = ppcVar4;
    sVar1 = handleData->count;
    ppcVar4[sVar1] = (char *)0x0;
    handleData->count = sVar1 + 1;
    iVar3 = mallocAndStrcpy_s(handleData->keys + sVar1,key);
    if (iVar3 == 0) {
      iVar3 = mallocAndStrcpy_s(handleData->values + (handleData->count - 1),value);
      if (iVar3 == 0) {
        return 0;
      }
      free(handleData->keys[handleData->count - 1]);
      Map_DecreaseStorageKeysValues(handleData);
      p_Var5 = xlogging_get_log_function();
      iVar3 = 0x149;
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return 0x149;
      }
      pcVar7 = "insertNewKeyValue";
      pcVar8 = "unable to mallocAndStrcpy_s";
      iVar6 = 0x148;
    }
    else {
      Map_DecreaseStorageKeysValues(handleData);
      p_Var5 = xlogging_get_log_function();
      iVar3 = 0x140;
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return 0x140;
      }
      pcVar7 = "insertNewKeyValue";
      pcVar8 = "unable to mallocAndStrcpy_s";
      iVar6 = 0x13f;
    }
  }
  else {
    p_Var5 = xlogging_get_log_function();
    iVar3 = 0x138;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return 0x138;
    }
    pcVar7 = "Map_IncreaseStorageKeysValues";
    pcVar8 = "realloc error, size:%zu";
    iVar6 = 0xac;
  }
LAB_0010ef98:
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
            ,pcVar7,iVar6,1,pcVar8);
  return iVar3;
}

Assistant:

static int Map_IncreaseStorageKeysValues(MAP_HANDLE_DATA* handleData)
{
    int result;
    char** newKeys;
    size_t realloc_size = safe_add_size_t(handleData->count, 1);
    realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));
    if (realloc_size == SIZE_MAX ||
        (newKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
    {
        LogError("realloc error, size:%zu", realloc_size);
        result = MU_FAILURE;
    }
    else
    {
        char** newValues;
        handleData->keys = newKeys;
        handleData->keys[handleData->count] = NULL;
        realloc_size = safe_add_size_t(handleData->count, 1);
        realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));
        if (realloc_size == SIZE_MAX ||
            (newValues = (char**)realloc(handleData->values, realloc_size)) == NULL)
        {
            LogError("realloc error, size:%zu", realloc_size);
            if (handleData->count == 0) /*avoiding an implementation defined behavior */
            {
                free(handleData->keys);
                handleData->keys = NULL;
            }
            else
            {
                char** undoneKeys;
                realloc_size = safe_multiply_size_t((handleData->count), sizeof(char*));
                if (realloc_size == SIZE_MAX ||
                    (undoneKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
                {
                    LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
                }
                else
                {
                    handleData->keys = undoneKeys;
                }
            }
            result = MU_FAILURE;
        }
        else
        {
            handleData->values = newValues;
            handleData->values[handleData->count] = NULL;
            handleData->count++;
            result = 0;
        }
    }
    return result;
}